

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::VarFanOutVisitor::compute_assign_chain
               (shared_ptr<kratos::Var> *var,
               vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               *queue)

{
  long lVar1;
  Var *pVVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  shared_ptr<kratos::AssignStmt> *__b;
  pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_> local_50;
  
  iVar3 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0xe])();
  if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x18) == 1) {
    iVar3 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[0xe])();
    lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10);
    lVar5 = (**(code **)(**(long **)(lVar1 + 8) + 0x20))();
    if (lVar5 == 0) {
      return;
    }
    __b = (shared_ptr<kratos::AssignStmt> *)(lVar1 + 8);
    iVar3 = (*(((__b->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Stmt).super_IRNode._vptr_IRNode[4])();
    if (*(int *)(CONCAT44(extraout_var_01,iVar3) + 0x48) != 0) {
      return;
    }
    pVVar2 = ((__b->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             left_;
    iVar3 = (*(pVVar2->super_IRNode)._vptr_IRNode[4])(pVVar2);
    iVar4 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[4])();
    if (CONCAT44(extraout_var_02,iVar3) != CONCAT44(extraout_var_03,iVar4)) {
      return;
    }
    iVar3 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x1d])(pVVar2);
    if ((char)iVar3 != '\0') {
      return;
    }
    if (((__b->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->right_
        != (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      return;
    }
    std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>::
    pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>,_true>(&local_50,var,__b)
    ;
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
    ::emplace_back<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>
              ((vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
                *)queue,&local_50);
    std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>::~pair(&local_50);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &pVVar2->super_enable_shared_from_this<kratos::Var>);
    compute_assign_chain(&local_50.first,queue);
  }
  else {
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&local_50,
               &var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_50.second.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
    ::emplace_back<std::pair<std::shared_ptr<kratos::Var>,decltype(nullptr)>>
              ((vector<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::pair<std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::AssignStmt>>>>
                *)queue,(pair<std::shared_ptr<kratos::Var>,_std::nullptr_t> *)&local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.first.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void static compute_assign_chain(
        const std::shared_ptr<Var>& var,
        std::vector<std::pair<std::shared_ptr<Var>, std::shared_ptr<AssignStmt>>>& queue) {
        if (var->sinks().size() == 1) {
            auto const& stmt = *(var->sinks().begin());
            if (!stmt->parent()) return;
            if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                auto* sink_var = stmt->left();
                if (sink_var->parent() != var->parent() || sink_var->is_interface()) {
                    // not the same parent
                    return;
                }
                // FIXME: need to re-work on fanout one wire removal
                //  For now disable the expression based search
                if (stmt->right() != var.get()) {
                    // expr based
                    return;
                }
                queue.emplace_back(std::make_pair(var, stmt));
                compute_assign_chain(sink_var->shared_from_this(), queue);
            }
        } else {
            queue.emplace_back(std::make_pair(var, nullptr));
        }
    }